

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Facet.hpp
# Opt level: O1

bool __thiscall
Parfait::Facet::triBoxOverlap
          (Facet *this,Point<double> *boxcenter,Point<double> *boxhalfsize,
          array<Parfait::Point<double>,_3UL> *triverts)

{
  bool bVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Point<double> v0;
  Point<double> v2;
  Point<double> v1;
  Point<double> normal;
  Point<double> local_a0;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58 [6];
  double local_28;
  undefined8 uStack_20;
  Point<double> local_18;
  
  local_58[0] = (boxcenter->pos)._M_elems[0];
  local_58[1] = (boxcenter->pos)._M_elems[1];
  local_a0.pos._M_elems[0] = triverts->_M_elems[0].pos._M_elems[0] - local_58[0];
  local_a0.pos._M_elems[1] = triverts->_M_elems[0].pos._M_elems[1] - local_58[1];
  local_58[2] = (boxcenter->pos)._M_elems[2];
  local_a0.pos._M_elems[2] = triverts->_M_elems[0].pos._M_elems[2] - local_58[2];
  local_58[3] = triverts->_M_elems[1].pos._M_elems[0] - local_58[0];
  local_58[4] = triverts->_M_elems[1].pos._M_elems[1] - local_58[1];
  local_58[5] = triverts->_M_elems[1].pos._M_elems[2] - local_58[2];
  local_58[0] = triverts->_M_elems[2].pos._M_elems[0] - local_58[0];
  local_58[1] = triverts->_M_elems[2].pos._M_elems[1] - local_58[1];
  local_58[2] = triverts->_M_elems[2].pos._M_elems[2] - local_58[2];
  dVar6 = local_58[4] - local_a0.pos._M_elems[1];
  dVar11 = local_58[5] - local_a0.pos._M_elems[2];
  dVar10 = dVar11 * local_a0.pos._M_elems[1] - dVar6 * local_a0.pos._M_elems[2];
  dVar4 = dVar11 * local_58[1] - dVar6 * local_58[2];
  dVar13 = dVar10;
  if (dVar4 <= dVar10) {
    dVar13 = dVar4;
  }
  dVar14 = (boxhalfsize->pos)._M_elems[2];
  dVar9 = (boxhalfsize->pos)._M_elems[1];
  dVar7 = ABS(dVar11) * dVar9 + ABS(dVar6) * dVar14;
  bVar1 = false;
  if (dVar13 + -1e-10 <= dVar7) {
    if (dVar4 <= dVar10) {
      dVar4 = dVar10;
    }
    if (-dVar7 <= dVar4 + 1e-10) {
      local_68 = local_58[3] - local_a0.pos._M_elems[0];
      dVar10 = local_a0.pos._M_elems[2] * local_68 - dVar11 * local_a0.pos._M_elems[0];
      uStack_60 = 0;
      dVar13 = local_68 * local_58[2] - dVar11 * local_58[0];
      dVar4 = dVar10;
      if (dVar13 <= dVar10) {
        dVar4 = dVar13;
      }
      dVar7 = (boxhalfsize->pos)._M_elems[0];
      dVar3 = ABS(dVar11) * dVar7 + ABS(local_68) * dVar14;
      bVar1 = false;
      if (dVar4 + -1e-10 <= dVar3) {
        if (dVar13 <= dVar10) {
          dVar13 = dVar10;
        }
        bVar1 = false;
        if (-dVar3 <= dVar13 + 1e-10) {
          dVar13 = dVar6 * local_58[3] - local_68 * local_58[4];
          dVar10 = dVar6 * local_58[0] - local_68 * local_58[1];
          dVar4 = dVar10;
          if (dVar13 <= dVar10) {
            dVar4 = dVar13;
          }
          dVar3 = ABS(dVar6) * dVar7 + ABS(local_68) * dVar9;
          bVar1 = false;
          if (dVar4 + -1e-10 <= dVar3) {
            if (dVar13 <= dVar10) {
              dVar13 = dVar10;
            }
            if (-dVar3 <= dVar13 + 1e-10) {
              dVar3 = local_58[1] - local_58[4];
              local_78 = local_58[2] - local_58[5];
              local_28 = -local_a0.pos._M_elems[2];
              uStack_20 = 0x8000000000000000;
              dVar10 = local_78 * local_a0.pos._M_elems[1] + dVar3 * local_28;
              uStack_70 = 0;
              dVar4 = local_78 * local_58[1] + -local_58[2] * dVar3;
              dVar13 = dVar10;
              if (dVar4 <= dVar10) {
                dVar13 = dVar4;
              }
              dVar8 = ABS(local_78) * dVar9 + ABS(dVar3) * dVar14;
              bVar1 = false;
              if (dVar13 + -1e-10 <= dVar8) {
                if (dVar4 <= dVar10) {
                  dVar4 = dVar10;
                }
                if (-dVar8 <= dVar4 + 1e-10) {
                  local_88 = local_58[0] - local_58[3];
                  dVar10 = local_a0.pos._M_elems[2] * local_88 - local_78 * local_a0.pos._M_elems[0]
                  ;
                  uStack_80 = 0;
                  dVar4 = local_88 * local_58[2] - local_78 * local_58[0];
                  dVar13 = dVar10;
                  if (dVar4 <= dVar10) {
                    dVar13 = dVar4;
                  }
                  dVar8 = ABS(local_78) * dVar7 + ABS(local_88) * dVar14;
                  bVar1 = false;
                  if (dVar13 + -1e-10 <= dVar8) {
                    if (dVar4 <= dVar10) {
                      dVar4 = dVar10;
                    }
                    if (-dVar8 <= dVar4 + 1e-10) {
                      dVar4 = dVar3 * local_a0.pos._M_elems[0] - local_88 * local_a0.pos._M_elems[1]
                      ;
                      dVar10 = dVar3 * local_58[3] + local_88 * -local_58[4];
                      dVar13 = dVar10;
                      if (dVar4 <= dVar10) {
                        dVar13 = dVar4;
                      }
                      dVar8 = ABS(dVar3) * dVar7 + ABS(local_88) * dVar9;
                      bVar1 = false;
                      if (dVar13 + -1e-10 <= dVar8) {
                        if (dVar4 <= dVar10) {
                          dVar4 = dVar10;
                        }
                        if (-dVar8 <= dVar4 + 1e-10) {
                          dVar10 = local_a0.pos._M_elems[1] - local_58[1];
                          dVar8 = local_a0.pos._M_elems[2] - local_58[2];
                          dVar12 = local_a0.pos._M_elems[1] * dVar8 + local_28 * dVar10;
                          dVar13 = local_58[4] * dVar8 - dVar10 * local_58[5];
                          dVar4 = dVar12;
                          if (dVar13 <= dVar12) {
                            dVar4 = dVar13;
                          }
                          dVar5 = ABS(dVar8) * dVar9 + ABS(dVar10) * dVar14;
                          bVar1 = false;
                          if (dVar4 + -1e-10 <= dVar5) {
                            if (dVar13 <= dVar12) {
                              dVar13 = dVar12;
                            }
                            if (-dVar5 <= dVar13 + 1e-10) {
                              dVar5 = local_a0.pos._M_elems[0] - local_58[0];
                              dVar12 = local_a0.pos._M_elems[2] * dVar5 -
                                       dVar8 * local_a0.pos._M_elems[0];
                              dVar13 = local_58[5] * dVar5 - dVar8 * local_58[3];
                              dVar4 = dVar12;
                              if (dVar13 <= dVar12) {
                                dVar4 = dVar13;
                              }
                              dVar14 = ABS(dVar8) * dVar7 + dVar14 * ABS(dVar5);
                              bVar1 = false;
                              if (dVar4 + -1e-10 <= dVar14) {
                                if (dVar13 <= dVar12) {
                                  dVar13 = dVar12;
                                }
                                if (-dVar14 <= dVar13 + 1e-10) {
                                  dVar13 = local_58[3] * dVar10 + -local_58[4] * dVar5;
                                  dVar14 = local_58[0] * dVar10 + -local_58[1] * dVar5;
                                  dVar4 = dVar14;
                                  if (dVar13 <= dVar14) {
                                    dVar4 = dVar13;
                                  }
                                  dVar10 = ABS(dVar10) * dVar7 + ABS(dVar5) * dVar9;
                                  bVar1 = false;
                                  if (dVar4 + -1e-10 <= dVar10) {
                                    if (dVar13 <= dVar14) {
                                      dVar13 = dVar14;
                                    }
                                    if (-dVar10 <= dVar13 + 1e-10) {
                                      lVar2 = 0;
                                      do {
                                        dVar4 = local_a0.pos._M_elems[lVar2];
                                        dVar13 = local_58[lVar2 + 3];
                                        dVar10 = local_58[lVar2];
                                        dVar14 = dVar13;
                                        if (dVar4 <= dVar13) {
                                          dVar14 = dVar4;
                                        }
                                        dVar9 = dVar10;
                                        if (dVar14 <= dVar10) {
                                          dVar9 = dVar14;
                                        }
                                        dVar14 = (boxhalfsize->pos)._M_elems[lVar2];
                                        if (dVar14 < dVar9 + -1e-10) {
                                          return false;
                                        }
                                        if (dVar13 <= dVar4) {
                                          dVar13 = dVar4;
                                        }
                                        if (dVar10 <= dVar13) {
                                          dVar10 = dVar13;
                                        }
                                        if (dVar10 + 1e-10 < -dVar14) {
                                          return false;
                                        }
                                        lVar2 = lVar2 + 1;
                                      } while (lVar2 != 3);
                                      local_18.pos._M_elems[0] = dVar6 * local_78 - dVar11 * dVar3;
                                      local_18.pos._M_elems[1] =
                                           local_88 * dVar11 - local_78 * local_68;
                                      local_18.pos._M_elems[2] = local_68 * dVar3 - dVar6 * local_88
                                      ;
                                      bVar1 = planeBoxOverlap(&local_18,&local_a0,boxhalfsize);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar1;
}

Assistant:

inline bool Parfait::Facet::triBoxOverlap(
    const Parfait::Point<double>& boxcenter,
    const Parfait::Point<double>& boxhalfsize,
    const std::array<Parfait::Point<double>,3>& triverts) const {

    auto v0 = triverts[0] - boxcenter;
    auto v1 = triverts[1] - boxcenter;
    auto v2 = triverts[2] - boxcenter;

    auto e0 = v1 - v0;
    auto e1 = v2 - v1;
    auto e2 = v0 - v2;

    auto fex = fabs(e0[0]);
    auto fey = fabs(e0[1]);
    auto fez = fabs(e0[2]);
    if(AXISTEST_X(e0[2], e0[1], fez, fey, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Y(e0[2], e0[0], fez, fex, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Z(e0[1], e0[0], fey, fex, v1, v2, boxhalfsize)) return false;

    fex = fabs(e1[0]);
    fey = fabs(e1[1]);
    fez = fabs(e1[2]);
    if(AXISTEST_X(e1[2], e1[1], fez, fey, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Y(e1[2], e1[0], fez, fex, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Z(e1[1], e1[0], fey, fex, v0, v1, boxhalfsize)) return false;

    fex = fabs(e2[0]);
    fey = fabs(e2[1]);
    fez = fabs(e2[2]);
    if(AXISTEST_X(e2[2], e2[1], fez, fey, v0, v1, boxhalfsize)) return false;
    if(AXISTEST_Y(e2[2], e2[0], fez, fex, v0, v1, boxhalfsize)) return false;
    if(AXISTEST_Z(e2[1], e2[0], fey, fex, v1, v2, boxhalfsize)) return false;

    for(int i = 0; i < 3; i++) {
        double min, max;
        std::tie(min, max) = findMinMax(v0[i], v1[i], v2[i]);
        if (min - TOL > boxhalfsize[i] || max + TOL < -boxhalfsize[i]) return false;
    }
    auto normal = Parfait::Point<double>::cross(e0, e1);
    return planeBoxOverlap(normal, v0, boxhalfsize);
}